

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  ExpressionSyntax *syntax_00;
  ConcatenationExpressionSyntax *pCVar1;
  bool bVar2;
  bitwidth_t value;
  ReplicationExpression *args_1;
  Expression *pEVar3;
  ReplicationExpression *expr;
  optional<int> value_00;
  Type *pTVar4;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  optional<unsigned_int> oVar5;
  Type *pTVar6;
  char *func;
  _Storage<int,_true> _Var7;
  ReplicationExpression *ctx;
  SourceRange SVar8;
  Token TVar9;
  Expression *right;
  ConstantValue leftVal;
  EvalContext evalCtx;
  Expression *local_2a0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_298;
  uint local_290;
  byte local_28b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_288;
  uint local_280;
  ushort local_27c;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_278;
  char local_258;
  undefined1 local_250 [12];
  uint32_t uStack_244;
  undefined4 uStack_240;
  undefined8 uStack_23c;
  undefined4 local_234;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_230;
  LValue **local_178;
  size_type local_170;
  size_type local_168;
  LValue *local_160 [5];
  SmallVectorBase<slang::Diagnostic> local_138;
  SourceLocation local_40;
  SourceLocation SStack_38;
  
  syntax_00 = (syntax->expression).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    goto LAB_003c8978;
  }
  args_1 = (ReplicationExpression *)
           Expression::selfDetermined
                     (compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x0);
  pCVar1 = (syntax->concatenation).ptr;
  if (pCVar1 == (ConcatenationExpressionSyntax *)0x0) {
LAB_003c8935:
    func = 
    "T slang::not_null<slang::syntax::ConcatenationExpressionSyntax *>::get() const [T = slang::syntax::ConcatenationExpressionSyntax *]"
    ;
    goto LAB_003c8978;
  }
  pEVar3 = Expression::create(compilation,(ExpressionSyntax *)pCVar1,context,
                              (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  pTVar6 = compilation->errorType;
  local_2a0 = pEVar3;
  SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_250._0_8_ = SVar8.startLoc;
  local_250._8_4_ = SVar8.endLoc._0_4_;
  uStack_244 = SVar8.endLoc._4_4_;
  expr = BumpAllocator::
         emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar6,(Expression *)args_1,pEVar3,
                    (SourceRange *)local_250);
  bVar2 = Expression::bad((Expression *)args_1);
  if ((bVar2) || (bVar2 = Expression::bad(local_2a0), bVar2)) goto LAB_003c86d4;
  pTVar6 = (args_1->super_Expression).type.ptr;
  if (pTVar6 != (Type *)0x0) {
    bVar2 = Type::isIntegral(pTVar6);
    if (bVar2) {
      pTVar6 = (local_2a0->type).ptr;
      if (pTVar6 != (Type *)0x0) {
        bVar2 = Type::isIntegral(pTVar6);
        if (!bVar2) {
          pTVar6 = (local_2a0->type).ptr;
          if (pTVar6 == (Type *)0x0) goto LAB_003c8963;
          pTVar4 = pTVar6->canonical;
          if (pTVar4 == (Type *)0x0) {
            Type::resolveCanonical(pTVar6);
            pTVar4 = pTVar6->canonical;
          }
          if ((pTVar4->super_Symbol).kind != StringType) goto LAB_003c8649;
        }
        local_230.data_ = (pointer)local_230.firstElement;
        local_250[8] = 2;
        uStack_244 = 0;
        uStack_240 = 0;
        uStack_23c = 0;
        local_234 = 0;
        local_230.len = 0;
        local_230.cap = 2;
        local_178 = local_160;
        local_170 = 0;
        local_168 = 5;
        local_138.data_ = (pointer)local_138.firstElement;
        local_138.len = 0;
        local_138.cap = 2;
        local_40 = (SourceLocation)0x0;
        SStack_38 = (SourceLocation)0x0;
        local_250._0_8_ = compilation;
        Expression::eval((ConstantValue *)&local_278,(Expression *)args_1,(EvalContext *)local_250);
        if (local_258 == '\0') {
          bVar2 = Expression::isImplicitString(local_2a0);
          if (bVar2) {
            ctx = (ReplicationExpression *)&local_2a0;
            Expression::contextDetermined
                      (context,(Expression **)ctx,compilation->stringType,(SourceLocation)0x0);
            expr->concat_ = local_2a0;
            if (compilation->stringType == (Type *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x1b,
                         "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                        );
            }
            (expr->super_Expression).type.ptr = compilation->stringType;
          }
          else {
            EvalContext::reportDiags((EvalContext *)local_250,context);
            ctx = expr;
            expr = (ReplicationExpression *)Expression::badExpr(compilation,&expr->super_Expression)
            ;
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_278);
          goto LAB_003c87ac;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_278);
        ctx = args_1;
        value_00 = ASTContext::evalInteger(context,(Expression *)args_1);
        if (((ulong)value_00.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
          _Var7._M_value =
               value_00.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          if (-1 < _Var7._M_value) {
            if (_Var7._M_value == 0) {
              if (((context->flags).m_bits & 1) == 0) {
                ASTContext::addDiag(context,(DiagCode)0x820007,
                                    (args_1->super_Expression).sourceRange);
                goto LAB_003c8796;
              }
              pTVar6 = compilation->voidType;
              if (pTVar6 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x1b,
                           "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                          );
              }
            }
            else {
              ctx = (ReplicationExpression *)&local_2a0;
              Expression::selfDetermined(context,(Expression **)ctx);
              expr->concat_ = local_2a0;
              pTVar6 = (local_2a0->type).ptr;
              if (pTVar6 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                          );
              }
              pTVar4 = pTVar6->canonical;
              if (pTVar4 == (Type *)0x0) {
                Type::resolveCanonical(pTVar6);
                pTVar4 = pTVar6->canonical;
              }
              if ((pTVar4->super_Symbol).kind == StringType) {
                if (compilation->stringType == (Type *)0x0) {
                  assert::assertFailed
                            ("ptr",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                             ,0x1b,
                             "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                            );
                }
                (expr->super_Expression).type.ptr = compilation->stringType;
                goto LAB_003c87ac;
              }
              local_288._0_4_ = _Var7._M_value & 0x7fffffff;
              local_288.val._4_4_ = 0;
              local_280 = 0x20;
              local_27c = 1;
              SVInt::clearUnusedBits((SVInt *)&local_288);
              pTVar6 = (local_2a0->type).ptr;
              if (pTVar6 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                          );
              }
              value = Type::getBitWidth(pTVar6);
              SVInt::SVInt<unsigned_int,void>((SVInt *)&local_298,value);
              SVInt::operator*((SVInt *)&local_278,(SVInt *)&local_288);
              SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
              oVar5 = ASTContext::requireValidBitWidth(context,(SVInt *)&local_278,SVar8);
              if (((0x40 < (uint)local_278._8_4_) || ((local_278._13_1_ & 1) != 0)) &&
                 ((void *)local_278._0_8_ != (void *)0x0)) {
                operator_delete__((void *)local_278._0_8_);
              }
              if (((0x40 < local_290) || ((local_28b & 1) != 0)) &&
                 ((Type *)local_298.val != (Type *)0x0)) {
                operator_delete__(local_298.pVal);
              }
              if (((0x40 < local_280) || ((local_27c & 0x100) != 0)) &&
                 ((ExpressionSyntax *)local_288.val != (ExpressionSyntax *)0x0)) {
                operator_delete__(local_288.pVal);
              }
              if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
                ctx = expr;
                expr = (ReplicationExpression *)
                       Expression::badExpr(compilation,&expr->super_Expression);
                goto LAB_003c87ac;
              }
              pTVar6 = (local_2a0->type).ptr;
              if (pTVar6 == (Type *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                          );
              }
              bVar2 = Type::isFourState(pTVar6);
              ctx = (ReplicationExpression *)
                    ((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0xffffffff);
              pTVar6 = Compilation::getType
                                 (compilation,
                                  oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>._M_payload,
                                  (bitmask<slang::ast::IntegralFlags>)(bVar2 * '\x02'));
            }
            (expr->super_Expression).type.ptr = pTVar6;
            goto LAB_003c87ac;
          }
          ASTContext::requireGtZero(context,value_00,(args_1->super_Expression).sourceRange);
        }
LAB_003c8796:
        ctx = expr;
        expr = (ReplicationExpression *)Expression::badExpr(compilation,&expr->super_Expression);
LAB_003c87ac:
        SmallVectorBase<slang::Diagnostic>::cleanup(&local_138,(EVP_PKEY_CTX *)ctx);
        if (local_178 != local_160) {
          free(local_178);
        }
        SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_230,(EVP_PKEY_CTX *)ctx);
        return &expr->super_Expression;
      }
    }
    else {
LAB_003c8649:
      pCVar1 = (syntax->concatenation).ptr;
      if (pCVar1 == (ConcatenationExpressionSyntax *)0x0) goto LAB_003c8935;
      TVar9 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pCVar1);
      local_250._0_8_ = TVar9._0_8_;
      local_250._8_4_ = TVar9.info._0_4_;
      uStack_244 = TVar9.info._4_4_;
      location = parsing::Token::location((Token *)local_250);
      diag = ASTContext::addDiag(context,(DiagCode)0x250007,location);
      pTVar6 = (args_1->super_Expression).type.ptr;
      if (pTVar6 != (Type *)0x0) {
        diag_00 = ast::operator<<(diag,pTVar6);
        pTVar6 = (local_2a0->type).ptr;
        if (pTVar6 != (Type *)0x0) {
          ast::operator<<(diag_00,pTVar6);
          Diagnostic::operator<<(diag,(args_1->super_Expression).sourceRange);
          Diagnostic::operator<<(diag,local_2a0->sourceRange);
LAB_003c86d4:
          pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
          return pEVar3;
        }
      }
    }
  }
LAB_003c8963:
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_003c8978:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(compilation, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportDiags(context);
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, compilation.getStringType());

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if ((context.flags & ASTFlags::InsideConcatenation) == 0) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}